

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

vector3 * vector3_rotate_by_quaternion(vector3 *self,quaternion *qT)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar1 = (qT->field_0).q[0];
  fVar2 = (qT->field_0).q[1];
  fVar3 = (qT->field_0).q[2];
  fVar4 = (qT->field_0).q[3];
  fVar7 = (self->field_0).v[2];
  fVar5 = (self->field_0).v[0];
  fVar6 = (self->field_0).v[1];
  fVar8 = fVar3 * fVar5 + (fVar4 * fVar6 - fVar7 * fVar1);
  fVar9 = (fVar4 * fVar7 + fVar1 * fVar6) - fVar2 * fVar5;
  fVar10 = (fVar4 * fVar5 + fVar2 * fVar7) - fVar3 * fVar6;
  fVar7 = (fVar5 * fVar1 - fVar6 * fVar2) - fVar7 * fVar3;
  (self->field_0).v[0] = fVar9 * fVar2 + ((fVar4 * fVar10 - fVar7 * fVar1) - fVar8 * fVar3);
  (self->field_0).v[1] = (fVar8 * fVar4 + (fVar3 * fVar10 - fVar7 * fVar2)) - fVar9 * fVar1;
  (self->field_0).v[2] = fVar9 * fVar4 + fVar8 * fVar1 + (fVar7 * -fVar3 - fVar10 * fVar2);
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_rotate_by_quaternion(struct vector3 *self, const struct quaternion *qT)
{
	struct quaternion qconj;
	struct quaternion q;

	/* make the conjugate */
	quaternion_set(&qconj, qT);
	quaternion_conjugate(&qconj);

	quaternion_set(&q, qT);
	quaternion_multiplyv3(&q, self);
	quaternion_multiply(&q, &qconj);

	self->x = q.x;
	self->y = q.y;
	self->z = q.z;

	return self;
}